

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream.cc
# Opt level: O1

Offset __thiscall
wabt::interp::Istream::Trace(Istream *this,Stream *stream,Offset offset,TraceSource *source)

{
  undefined1 *puVar1;
  char *pcVar2;
  Instr instr;
  undefined8 uVar3;
  undefined8 uVar4;
  Instr local_d8;
  float local_bc;
  Info local_b8;
  char *local_80;
  Offset local_74;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_74 = offset;
  Read(&local_d8,this,&local_74);
  (*source->_vptr_TraceSource[2])(local_70,source,(ulong)offset);
  puVar1 = local_70[0];
  Opcode::GetInfo(&local_b8,&local_d8.op);
  Stream::Writef(stream,"%s| %s",puVar1,local_b8.name);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  switch(local_d8.kind) {
  case Imm_0_Op_0:
    Stream::Writef(stream,"\n");
    break;
  case Imm_0_Op_1:
    (*source->_vptr_TraceSource[3])(&local_b8,source,1);
    Stream::Writef(stream," %s\n",local_b8.name);
    goto LAB_001b36dc;
  case Imm_0_Op_2:
    (*source->_vptr_TraceSource[3])(&local_b8,source,2);
    pcVar2 = local_b8.name;
    (*source->_vptr_TraceSource[3])(local_70,source,1);
    Stream::Writef(stream," %s, %s\n",pcVar2,local_70[0]);
    goto LAB_001b36c9;
  case Imm_0_Op_3:
    (*source->_vptr_TraceSource[3])(&local_b8,source,3);
    pcVar2 = local_b8.name;
    (*source->_vptr_TraceSource[3])(local_70,source,2);
    puVar1 = local_70[0];
    (*source->_vptr_TraceSource[3])(local_50,source,1);
    Stream::Writef(stream," %s, %s, %s\n",pcVar2,puVar1,local_50[0]);
    goto LAB_001b35e0;
  case Imm_Jump_Op_0:
    pcVar2 = " @%u\n";
    goto LAB_001b30ad;
  case Imm_Jump_Op_1:
    (*source->_vptr_TraceSource[3])(&local_b8,source,1);
    pcVar2 = " @%u, %s\n";
    goto LAB_001b3636;
  case Imm_Index_Op_0:
  case Imm_Index_Op_N:
    pcVar2 = " $%u\n";
    goto LAB_001b30ad;
  case Imm_Index_Op_1:
    (*source->_vptr_TraceSource[3])(&local_b8,source,1);
    pcVar2 = " $%u, %s\n";
LAB_001b3636:
    Stream::Writef(stream,pcVar2,(ulong)local_d8.field_2.imm_u32,local_b8.name);
    goto LAB_001b36dc;
  case Imm_Index_Op_2:
    (*source->_vptr_TraceSource[3])(&local_b8,source,2);
    pcVar2 = local_b8.name;
    (*source->_vptr_TraceSource[3])(local_70,source,1);
    Stream::Writef(stream," $%u, %s, %s\n",(ulong)local_d8.field_2.imm_u32,pcVar2,local_70[0]);
    goto LAB_001b36c9;
  case Imm_Index_Op_3:
    local_bc = (float)local_d8.field_2.imm_u32;
    (*source->_vptr_TraceSource[3])(&local_b8,source,3);
    pcVar2 = local_b8.name;
    (*source->_vptr_TraceSource[3])(local_70,source,2);
    puVar1 = local_70[0];
    uVar4 = CONCAT44(local_d8.field_2._12_4_,local_d8.field_2._8_4_);
    uVar3 = CONCAT44(local_d8.kind,local_d8.op.enum_);
    (*source->_vptr_TraceSource[3])(local_50,source,1);
    Stream::Writef(stream," $%u, %s, %s, %s\n",(ulong)(uint)local_bc,pcVar2,puVar1,local_50[0],uVar3
                   ,local_d8.field_2.imm_u32,uVar4);
    goto LAB_001b35e0;
  case Imm_Index_Index_Op_3:
    local_bc = (float)local_d8.field_2.imm_u32;
    local_80 = (char *)CONCAT44(local_80._4_4_,local_d8.field_2.imm_u32x2.snd);
    (*source->_vptr_TraceSource[3])(&local_b8,source,3);
    pcVar2 = local_b8.name;
    (*source->_vptr_TraceSource[3])(local_70,source,2);
    puVar1 = local_70[0];
    uVar4 = CONCAT44(local_d8.field_2._12_4_,local_d8.field_2._8_4_);
    (*source->_vptr_TraceSource[3])(local_50,source,1);
    Stream::Writef(stream," $%u, $%u, %s, %s, %s\n",(ulong)(uint)local_bc,
                   (ulong)local_80 & 0xffffffff,pcVar2,puVar1,local_50[0],local_d8.field_2.imm_u32,
                   uVar4);
    goto LAB_001b35e0;
  case Imm_Index_Index_Op_N:
    pcVar2 = " $%u, $%u\n";
    goto LAB_001b3443;
  case Imm_Index_Offset_Op_1:
    (*source->_vptr_TraceSource[3])(&local_b8,source,1);
    Stream::Writef(stream," $%u:%s+$%u\n",(ulong)local_d8.field_2.imm_u32,local_b8.name,
                   (ulong)local_d8.field_2.imm_u32x2.snd);
    goto LAB_001b36dc;
  case Imm_Index_Offset_Op_2:
    local_bc = (float)local_d8.field_2.imm_u32;
    (*source->_vptr_TraceSource[3])(&local_b8,source,2);
    pcVar2 = local_b8.name;
    uVar4 = CONCAT44(local_d8.field_2._12_4_,local_d8.field_2._8_4_);
    uVar3 = CONCAT44(local_d8.kind,local_d8.op.enum_);
    (*source->_vptr_TraceSource[3])(local_70,source,1);
    Stream::Writef(stream," $%u:%s+$%u, %s\n",(ulong)(uint)local_bc,pcVar2,
                   (ulong)local_d8.field_2.imm_u32x2.snd,local_70[0],uVar3,local_d8.field_2.imm_u32,
                   uVar4);
    goto LAB_001b36c9;
  case Imm_Index_Offset_Op_3:
    local_bc = (float)local_d8.field_2.imm_u32;
    (*source->_vptr_TraceSource[3])(&local_b8,source,3);
    local_80 = local_b8.name;
    (*source->_vptr_TraceSource[3])(local_70,source,2);
    puVar1 = local_70[0];
    uVar4 = CONCAT44(local_d8.field_2._12_4_,local_d8.field_2._8_4_);
    (*source->_vptr_TraceSource[3])(local_50,source,1);
    Stream::Writef(stream," $%u:%s+$%u, %s, %s\n",(ulong)(uint)local_bc,local_80,
                   (ulong)local_d8.field_2.imm_u32x2.snd,puVar1,local_50[0],local_d8.field_2.imm_u32
                   ,uVar4);
LAB_001b35e0:
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    goto LAB_001b36c9;
  case Imm_I32_Op_0:
    pcVar2 = " %u\n";
LAB_001b30ad:
    Stream::Writef(stream,pcVar2,(ulong)local_d8.field_2.imm_u32);
    break;
  case Imm_I64_Op_0:
    Stream::Writef(stream," %lu\n",CONCAT44(local_d8.field_2.imm_u32x2.snd,local_d8.field_2.imm_u32)
                  );
    break;
  case Imm_F32_Op_0:
    local_d8.field_2.imm_u32 = SUB84((double)(float)local_d8.field_2.imm_f32,0);
    goto LAB_001b3705;
  case Imm_F64_Op_0:
LAB_001b3705:
    Stream::Writef(stream," %g\n",local_d8.field_2.imm_u32);
    break;
  case Imm_I32_I32_Op_0:
    pcVar2 = " $%u $%u\n";
LAB_001b3443:
    Stream::Writef(stream,pcVar2,(ulong)local_d8.field_2.imm_u32,
                   (ulong)local_d8.field_2.imm_u32x2.snd);
    break;
  case Imm_I8_Op_1:
    (*source->_vptr_TraceSource[3])(&local_b8,source,1);
    Stream::Writef(stream," %s : (Lane imm: %u)\n",local_b8.name,(ulong)local_d8.field_2.imm_u8);
    goto LAB_001b36dc;
  case Imm_I8_Op_2:
    (*source->_vptr_TraceSource[3])(&local_b8,source,2);
    pcVar2 = local_b8.name;
    (*source->_vptr_TraceSource[3])(local_70,source,1);
    Stream::Writef(stream," %s, %s : (Lane imm: $%u)\n",pcVar2,local_70[0],
                   (ulong)local_d8.field_2.imm_u8);
    goto LAB_001b36c9;
  case Imm_V128_Op_0:
    Stream::Writef(stream," i32x4 0x%08x 0x%08x 0x%08x 0x%08x\n",(ulong)local_d8.field_2.imm_u32,
                   (ulong)local_d8.field_2.imm_u32x2.snd,(ulong)(uint)local_d8.field_2._8_4_,
                   (ulong)(uint)local_d8.field_2._12_4_);
    break;
  case Imm_V128_Op_2:
    (*source->_vptr_TraceSource[3])(&local_b8,source,2);
    pcVar2 = local_b8.name;
    uVar4 = CONCAT44(local_d8.field_2._12_4_,local_d8.field_2._8_4_);
    (*source->_vptr_TraceSource[3])(local_70,source,1);
    Stream::Writef(stream," %s, %s : (Lane imm: i32x4 0x%08x 0x%08x 0x%08x 0x%08x )\n",pcVar2,
                   local_70[0],(ulong)local_d8.field_2.imm_u32,(ulong)local_d8.field_2.imm_u32x2.snd
                   ,CONCAT44(local_d8.kind,local_d8.field_2._8_4_),local_d8.field_2._12_4_,uVar4);
LAB_001b36c9:
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
LAB_001b36dc:
    if ((Type *)local_b8.name != &local_b8.result_type) {
      operator_delete(local_b8.name);
    }
  }
  return local_74;
}

Assistant:

Istream::Offset Istream::Trace(Stream* stream,
                               Offset offset,
                               TraceSource* source) const {
  Offset start = offset;
  Instr instr = Read(&offset);
  stream->Writef("%s| %s", source->Header(start).c_str(), instr.op.GetName());

  switch (instr.kind) {
    case InstrKind::Imm_0_Op_0:
      stream->Writef("\n");
      break;

    case InstrKind::Imm_0_Op_1:
      stream->Writef(" %s\n", source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_0_Op_2:
      stream->Writef(" %s, %s\n", source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_0_Op_3:
      stream->Writef(" %s, %s, %s\n", source->Pick(3, instr).c_str(),
                     source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Jump_Op_0:
      stream->Writef(" @%u\n", instr.imm_u32);
      break;

    case InstrKind::Imm_Jump_Op_1:
      stream->Writef(" @%u, %s\n", instr.imm_u32,
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Op_0:
      stream->Writef(" $%u\n", instr.imm_u32);
      break;

    case InstrKind::Imm_Index_Op_1:
      stream->Writef(" $%u, %s\n", instr.imm_u32,
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Op_2:
      stream->Writef(" $%u, %s, %s\n", instr.imm_u32,
                     source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Op_3:
      stream->Writef(
          " $%u, %s, %s, %s\n", instr.imm_u32, source->Pick(3, instr).c_str(),
          source->Pick(2, instr).c_str(), source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Op_N:
      stream->Writef(" $%u\n", instr.imm_u32); // TODO param/result count?
      break;

    case InstrKind::Imm_Index_Index_Op_3:
      stream->Writef(" $%u, $%u, %s, %s, %s\n", instr.imm_u32x2.fst,
                     instr.imm_u32x2.snd, source->Pick(3, instr).c_str(),
                     source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Index_Op_N:
      stream->Writef(" $%u, $%u\n", instr.imm_u32x2.fst,
                     instr.imm_u32x2.snd);  // TODO param/result count?
      break;

    case InstrKind::Imm_Index_Offset_Op_1:
      stream->Writef(" $%u:%s+$%u\n", instr.imm_u32x2.fst,
                     source->Pick(1, instr).c_str(), instr.imm_u32x2.snd);
      break;

    case InstrKind::Imm_Index_Offset_Op_2:
      stream->Writef(" $%u:%s+$%u, %s\n", instr.imm_u32x2.fst,
                     source->Pick(2, instr).c_str(), instr.imm_u32x2.snd,
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Offset_Op_3:
      stream->Writef(" $%u:%s+$%u, %s, %s\n", instr.imm_u32x2.fst,
                     source->Pick(3, instr).c_str(), instr.imm_u32x2.snd,
                     source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_I32_Op_0:
      stream->Writef(" %u\n", instr.imm_u32);
      break;

    case InstrKind::Imm_I64_Op_0:
      stream->Writef(" %" PRIu64 "\n", instr.imm_u64);
      break;

    case InstrKind::Imm_F32_Op_0:
      stream->Writef(" %g\n", instr.imm_f32);
      break;

    case InstrKind::Imm_F64_Op_0:
      stream->Writef(" %g\n", instr.imm_f64);
      break;

    case InstrKind::Imm_I32_I32_Op_0:
      stream->Writef(" $%u $%u\n", instr.imm_u32x2.fst, instr.imm_u32x2.snd);
      break;

    case InstrKind::Imm_I8_Op_1:
      // TODO: cleanup
      stream->Writef(" %s : (Lane imm: %u)\n", source->Pick(1, instr).c_str(),
                     instr.imm_u8);
      break;

    case InstrKind::Imm_I8_Op_2:
      // TODO: cleanup
      stream->Writef(" %s, %s : (Lane imm: $%u)\n",
                     source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str(), instr.imm_u8);
      break;

    case InstrKind::Imm_V128_Op_0:
      stream->Writef(" i32x4 0x%08x 0x%08x 0x%08x 0x%08x\n",
                     instr.imm_v128.u32(0), instr.imm_v128.u32(1),
                     instr.imm_v128.u32(2), instr.imm_v128.u32(3));
      break;

    case InstrKind::Imm_V128_Op_2:
      // TODO: cleanup
      stream->Writef(
          " %s, %s : (Lane imm: i32x4 0x%08x 0x%08x 0x%08x 0x%08x )\n",
          source->Pick(2, instr).c_str(), source->Pick(1, instr).c_str(),
          instr.imm_v128.u32(0), instr.imm_v128.u32(1), instr.imm_v128.u32(2),
          instr.imm_v128.u32(3));
      break;
  }
  return offset;
}